

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

SQTable * CreateDefaultDelegate(SQSharedState *ss,SQRegFunction *funcz)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  bool bVar4;
  SQTable *this;
  SQObjectValue SVar5;
  SQString *pSVar6;
  SQRegFunction *pSVar7;
  long lVar8;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  this = (SQTable *)sq_vm_malloc(0x58);
  lVar8 = 0;
  SQTable::SQTable(this,ss,0);
  (this->super_SQDelegable)._delegate = (SQTable *)0x0;
  do {
    if (funcz[lVar8].name == (SQChar *)0x0) {
      return this;
    }
    pSVar7 = funcz + lVar8;
    SVar5.pNativeClosure = SQNativeClosure::Create(ss,pSVar7->f,0);
    ((SVar5.pTable)->super_SQDelegable)._delegate = (SQTable *)pSVar7->nparamscheck;
    pSVar6 = SQString::Create(ss,pSVar7->name,-1);
    pSVar3 = ((SQObjectValue *)&((SVar5.pGenerator)->_ci)._generator)->pTable;
    SVar2 = ((SVar5.pNativeClosure)->_name).super_SQObject._type;
    ((SVar5.pNativeClosure)->_name).super_SQObject._type = OT_STRING;
    ((SQObjectValue *)&((SVar5.pGenerator)->_ci)._generator)->pString = pSVar6;
    pSVar1 = &(pSVar6->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    if ((pSVar7->typemask == (SQChar *)0x0) ||
       (bVar4 = CompileTypemask(&(SVar5.pNativeClosure)->_typecheck,pSVar7->typemask), bVar4)) {
      local_40.super_SQObject._unVal.pString = SQString::Create(ss,pSVar7->name,-1);
      local_40.super_SQObject._type = OT_STRING;
      if (local_40.super_SQObject._unVal.pTable == (SQTable *)0x0) {
        __assert_fail("_unVal.pTable",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqobject.h"
                      ,0xea,"SQObjectPtr::SQObjectPtr(SQString *)");
      }
      pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      local_50.super_SQObject._type = OT_NATIVECLOSURE;
      local_50.super_SQObject._unVal.pNativeClosure = SVar5.pNativeClosure;
      if ((SQNativeClosure *)SVar5.pTable == (SQNativeClosure *)0x0) {
        __assert_fail("_unVal.pTable",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqobject.h"
                      ,0xe7,"SQObjectPtr::SQObjectPtr(SQNativeClosure *)");
      }
      pSVar1 = &((SVar5.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQTable::NewSlot(this,&local_40,&local_50);
      SQObjectPtr::~SQObjectPtr(&local_50);
      SQObjectPtr::~SQObjectPtr(&local_40);
      lVar8 = lVar8 + 1;
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    if (!bVar4) {
      return (SQTable *)0x0;
    }
  } while( true );
}

Assistant:

SQTable *CreateDefaultDelegate(SQSharedState *ss,const SQRegFunction *funcz)
{
    SQInteger i=0;
    SQTable *t=SQTable::Create(ss,0);
    while(funcz[i].name!=0){
        SQNativeClosure *nc = SQNativeClosure::Create(ss,funcz[i].f,0);
        nc->_nparamscheck = funcz[i].nparamscheck;
        nc->_name = SQString::Create(ss,funcz[i].name);
        if(funcz[i].typemask && !CompileTypemask(nc->_typecheck,funcz[i].typemask))
            return NULL;
        t->NewSlot(SQString::Create(ss,funcz[i].name),nc);
        i++;
    }
    return t;
}